

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void enableRawMouseMotion(_GLFWwindow *window)

{
  uchar local_14 [4];
  XIEventMask em;
  
  em.mask = local_14;
  local_14[0] = '\0';
  local_14[1] = '\0';
  em.deviceid = 1;
  em.mask_len = 3;
  local_14[2] = 2;
  (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&em,1);
  return;
}

Assistant:

static void enableRawMouseMotion(_GLFWwindow* window)
{
    XIEventMask em;
    unsigned char mask[XIMaskLen(XI_RawMotion)] = { 0 };

    em.deviceid = XIAllMasterDevices;
    em.mask_len = sizeof(mask);
    em.mask = mask;
    XISetMask(mask, XI_RawMotion);

    XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
}